

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O0

int kwsysProcessCreate(cmsysProcess *cp,int prIndex,kwsysProcessCreateInformation *si)

{
  int iVar1;
  pid_t pVar2;
  __pid_t _Var3;
  ssize_t sVar4;
  int *piVar5;
  bool bVar6;
  long local_150;
  kwsysProcess_ssize_t n;
  kwsysProcess_ssize_t total;
  ssize_t readRes;
  int local_130;
  int iStack_12c;
  char tmp;
  int pgidPipe [2];
  sigset_t old_mask;
  sigset_t mask;
  kwsysProcessCreateInformation *si_local;
  int prIndex_local;
  cmsysProcess *cp_local;
  
  iVar1 = pipe(si->ErrorPipe);
  if (iVar1 < 0) {
    cp_local._4_4_ = 0;
  }
  else {
    iVar1 = pipe(&local_130);
    if (iVar1 < 0) {
      kwsysProcessCleanupDescriptor(si->ErrorPipe);
      kwsysProcessCleanupDescriptor(si->ErrorPipe + 1);
      cp_local._4_4_ = 0;
    }
    else {
      iVar1 = fcntl64(si->ErrorPipe[1],2,1);
      if ((iVar1 < 0) || (iVar1 = fcntl64(iStack_12c,2,1), iVar1 < 0)) {
        kwsysProcessCleanupDescriptor(si->ErrorPipe);
        kwsysProcessCleanupDescriptor(si->ErrorPipe + 1);
        kwsysProcessCleanupDescriptor(&local_130);
        kwsysProcessCleanupDescriptor(&stack0xfffffffffffffed4);
        cp_local._4_4_ = 0;
      }
      else {
        sigemptyset((sigset_t *)(old_mask.__val + 0xf));
        sigaddset((sigset_t *)(old_mask.__val + 0xf),2);
        sigaddset((sigset_t *)(old_mask.__val + 0xf),0xf);
        iVar1 = sigprocmask(0,(sigset_t *)(old_mask.__val + 0xf),(sigset_t *)pgidPipe);
        if (iVar1 < 0) {
          kwsysProcessCleanupDescriptor(si->ErrorPipe);
          kwsysProcessCleanupDescriptor(si->ErrorPipe + 1);
          kwsysProcessCleanupDescriptor(&local_130);
          kwsysProcessCleanupDescriptor(&stack0xfffffffffffffed4);
          cp_local._4_4_ = 0;
        }
        else {
          pVar2 = kwsysProcessFork(cp,si);
          cp->ForkPIDs[prIndex] = pVar2;
          if (cp->ForkPIDs[prIndex] < 0) {
            sigprocmask(2,(sigset_t *)pgidPipe,(sigset_t *)0x0);
            kwsysProcessCleanupDescriptor(si->ErrorPipe);
            kwsysProcessCleanupDescriptor(si->ErrorPipe + 1);
            kwsysProcessCleanupDescriptor(&local_130);
            kwsysProcessCleanupDescriptor(&stack0xfffffffffffffed4);
            cp_local._4_4_ = 0;
          }
          else {
            if (cp->ForkPIDs[prIndex] == 0) {
              close(si->ErrorPipe[0]);
              close(local_130);
              if (si->StdIn < 1) {
                if (si->StdIn < 0) {
                  close(0);
                }
              }
              else {
                dup2(si->StdIn,0);
              }
              if (si->StdOut != 1) {
                dup2(si->StdOut,1);
              }
              if (si->StdErr != 2) {
                dup2(si->StdErr,2);
              }
              fcntl64(0,2);
              fcntl64(1,2,0);
              fcntl64(2,2,0);
              kwsysProcessRestoreDefaultSignalHandlers();
              sigprocmask(2,(sigset_t *)pgidPipe,(sigset_t *)0x0);
              if ((cp->CreateProcessGroup != 0) && (_Var3 = setsid(), _Var3 < 0)) {
                kwsysProcessChildErrorExit(si->ErrorPipe[1]);
              }
              execvp(*cp->Commands[prIndex],cp->Commands[prIndex]);
              kwsysProcessChildErrorExit(si->ErrorPipe[1]);
            }
            kwsysProcessCleanupDescriptor(si->ErrorPipe + 1);
            kwsysProcessCleanupDescriptor(&stack0xfffffffffffffed4);
            do {
              sVar4 = read(local_130,(void *)((long)&readRes + 7),1);
            } while (0 < sVar4);
            if (sVar4 < 0) {
              sigprocmask(2,(sigset_t *)pgidPipe,(sigset_t *)0x0);
              kwsysProcessCleanupDescriptor(si->ErrorPipe);
              kwsysProcessCleanupDescriptor(&local_130);
              cp_local._4_4_ = 0;
            }
            else {
              kwsysProcessCleanupDescriptor(&local_130);
              iVar1 = sigprocmask(2,(sigset_t *)pgidPipe,(sigset_t *)0x0);
              if (iVar1 < 0) {
                kwsysProcessCleanupDescriptor(si->ErrorPipe);
                cp_local._4_4_ = 0;
              }
              else {
                cp->CommandsLeft = cp->CommandsLeft + 1;
                n = 0;
                local_150 = 1;
                while (n < 0x400 && 0 < local_150) {
                  do {
                    local_150 = read(si->ErrorPipe[0],cp->ErrorMessage + n,0x400 - n);
                    bVar6 = false;
                    if (local_150 < 0) {
                      piVar5 = __errno_location();
                      bVar6 = *piVar5 == 4;
                    }
                  } while (bVar6);
                  if (0 < local_150) {
                    n = local_150 + n;
                  }
                }
                kwsysProcessCleanupDescriptor(si->ErrorPipe);
                if (n < 1) {
                  cp_local._4_4_ = 1;
                }
                else {
                  cp_local._4_4_ = 0;
                }
              }
            }
          }
        }
      }
    }
  }
  return cp_local._4_4_;
}

Assistant:

static int kwsysProcessCreate(kwsysProcess* cp, int prIndex,
                              kwsysProcessCreateInformation* si)
{
  sigset_t mask, old_mask;
  int pgidPipe[2];
  char tmp;
  ssize_t readRes;

  /* Create the error reporting pipe.  */
  if(pipe(si->ErrorPipe) < 0)
    {
    return 0;
    }

  /* Create a pipe for detecting that the child process has created a process
     group and session.  */
  if(pipe(pgidPipe) < 0)
    {
    kwsysProcessCleanupDescriptor(&si->ErrorPipe[0]);
    kwsysProcessCleanupDescriptor(&si->ErrorPipe[1]);
    return 0;
    }

  /* Set close-on-exec flag on the pipe's write end.  */
  if(fcntl(si->ErrorPipe[1], F_SETFD, FD_CLOEXEC) < 0 ||
     fcntl(pgidPipe[1], F_SETFD, FD_CLOEXEC) < 0)
    {
    kwsysProcessCleanupDescriptor(&si->ErrorPipe[0]);
    kwsysProcessCleanupDescriptor(&si->ErrorPipe[1]);
    kwsysProcessCleanupDescriptor(&pgidPipe[0]);
    kwsysProcessCleanupDescriptor(&pgidPipe[1]);
    return 0;
    }

  /* Block SIGINT / SIGTERM while we start.  The purpose is so that our signal
     handler doesn't get called from the child process after the fork and
     before the exec, and subsequently start kill()'ing PIDs from ForkPIDs. */
  sigemptyset(&mask);
  sigaddset(&mask, SIGINT);
  sigaddset(&mask, SIGTERM);
  if(sigprocmask(SIG_BLOCK, &mask, &old_mask) < 0)
    {
    kwsysProcessCleanupDescriptor(&si->ErrorPipe[0]);
    kwsysProcessCleanupDescriptor(&si->ErrorPipe[1]);
    kwsysProcessCleanupDescriptor(&pgidPipe[0]);
    kwsysProcessCleanupDescriptor(&pgidPipe[1]);
    return 0;
    }

  /* Fork off a child process.  */
#if defined(__VMS)
  /* VMS needs vfork and execvp to be in the same function because
     they use setjmp/longjmp to run the child startup code in the
     parent!  TODO: OptionDetach.  Also
     TODO:  CreateProcessGroup.  */
  cp->ForkPIDs[prIndex] = vfork();
#else
  cp->ForkPIDs[prIndex] = kwsysProcessFork(cp, si);
#endif
  if(cp->ForkPIDs[prIndex] < 0)
    {
    sigprocmask(SIG_SETMASK, &old_mask, 0);
    kwsysProcessCleanupDescriptor(&si->ErrorPipe[0]);
    kwsysProcessCleanupDescriptor(&si->ErrorPipe[1]);
    kwsysProcessCleanupDescriptor(&pgidPipe[0]);
    kwsysProcessCleanupDescriptor(&pgidPipe[1]);
    return 0;
    }

  if(cp->ForkPIDs[prIndex] == 0)
    {
#if defined(__VMS)
    /* Specify standard pipes for child process.  */
    decc$set_child_standard_streams(si->StdIn, si->StdOut, si->StdErr);
#else
    /* Close the read end of the error reporting / process group
       setup pipe.  */
    close(si->ErrorPipe[0]);
    close(pgidPipe[0]);

    /* Setup the stdin, stdout, and stderr pipes.  */
    if(si->StdIn > 0)
      {
      dup2(si->StdIn, 0);
      }
    else if(si->StdIn < 0)
      {
      close(0);
      }
    if(si->StdOut != 1)
      {
      dup2(si->StdOut, 1);
      }
    if(si->StdErr != 2)
      {
      dup2(si->StdErr, 2);
      }

    /* Clear the close-on-exec flag for stdin, stdout, and stderr.
       All other pipe handles will be closed when exec succeeds.  */
    fcntl(0, F_SETFD, 0);
    fcntl(1, F_SETFD, 0);
    fcntl(2, F_SETFD, 0);

    /* Restore all default signal handlers. */
    kwsysProcessRestoreDefaultSignalHandlers();

    /* Now that we have restored default signal handling and created the
       process group, restore mask.  */
    sigprocmask(SIG_SETMASK, &old_mask, 0);

    /* Create new process group.  We use setsid instead of setpgid to avoid
       the child getting hung up on signals like SIGTTOU.  (In the real world,
       this has been observed where "git svn" ends up calling the "resize"
       program which opens /dev/tty.  */
    if(cp->CreateProcessGroup && setsid() < 0)
      {
      kwsysProcessChildErrorExit(si->ErrorPipe[1]);
      }
#endif

    /* Execute the real process.  If successful, this does not return.  */
    execvp(cp->Commands[prIndex][0], cp->Commands[prIndex]);
    /* TODO: What does VMS do if the child fails to start?  */
    /* TODO: On VMS, how do we put the process in a new group?  */

    /* Failure.  Report error to parent and terminate.  */
    kwsysProcessChildErrorExit(si->ErrorPipe[1]);
    }

#if defined(__VMS)
  /* Restore the standard pipes of this process.  */
  decc$set_child_standard_streams(0, 1, 2);
#endif

  /* We are done with the error reporting pipe and process group setup pipe
     write end.  */
  kwsysProcessCleanupDescriptor(&si->ErrorPipe[1]);
  kwsysProcessCleanupDescriptor(&pgidPipe[1]);

  /* Make sure the child is in the process group before we proceed.  This
     avoids race conditions with calls to the kill function that we make for
     signalling process groups.  */
  while((readRes = read(pgidPipe[0], &tmp, 1)) > 0);
  if(readRes < 0)
    {
    sigprocmask(SIG_SETMASK, &old_mask, 0);
    kwsysProcessCleanupDescriptor(&si->ErrorPipe[0]);
    kwsysProcessCleanupDescriptor(&pgidPipe[0]);
    return 0;
    }
  kwsysProcessCleanupDescriptor(&pgidPipe[0]);

  /* Unmask signals.  */
  if(sigprocmask(SIG_SETMASK, &old_mask, 0) < 0)
    {
    kwsysProcessCleanupDescriptor(&si->ErrorPipe[0]);
    return 0;
    }

  /* A child has been created.  */
  ++cp->CommandsLeft;

  /* Block until the child's exec call succeeds and closes the error
     pipe or writes data to the pipe to report an error.  */
  {
  kwsysProcess_ssize_t total = 0;
  kwsysProcess_ssize_t n = 1;
  /* Read the entire error message up to the length of our buffer.  */
  while(total < KWSYSPE_PIPE_BUFFER_SIZE && n > 0)
    {
    /* Keep trying to read until the operation is not interrupted.  */
    while(((n = read(si->ErrorPipe[0], cp->ErrorMessage+total,
                     (size_t)(KWSYSPE_PIPE_BUFFER_SIZE-total))) < 0) &&
          (errno == EINTR));
    if(n > 0)
      {
      total += n;
      }
    }

  /* We are done with the error reporting pipe read end.  */
  kwsysProcessCleanupDescriptor(&si->ErrorPipe[0]);

  if(total > 0)
    {
    /* The child failed to execute the process.  */
    return 0;
    }
  }

  return 1;
}